

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O0

string * duckdb::NumericHelper::ToString<unsigned_int>(uint value)

{
  string *in_RDI;
  uint in_stack_0000001c;
  
  std::__cxx11::to_string(in_stack_0000001c);
  return in_RDI;
}

Assistant:

static std::string ToString(T value) {
		return std::to_string(value);
	}